

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int SynthesizeFrame(WebPDemuxer *dmux,Frame *frame,WebPIterator *iter)

{
  uint8_t *puVar1;
  int *in_RDX;
  Frame *in_RSI;
  long in_RDI;
  uint8_t *payload;
  size_t payload_size;
  uint8_t *mem_buf;
  size_t local_30;
  uint8_t *local_28;
  int *local_20;
  Frame *local_18;
  long local_10;
  uint local_4;
  
  local_28 = *(uint8_t **)(in_RDI + 0x20);
  local_30 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  puVar1 = GetFramePayload(local_28,in_RSI,&local_30);
  if (puVar1 != (uint8_t *)0x0) {
    *local_20 = local_18->frame_num_;
    local_20[1] = *(int *)(local_10 + 0x44);
    local_20[2] = local_18->x_offset_;
    local_20[3] = local_18->y_offset_;
    local_20[4] = local_18->width_;
    local_20[5] = local_18->height_;
    local_20[0xe] = local_18->has_alpha_;
    local_20[6] = local_18->duration_;
    local_20[7] = local_18->dispose_method_;
    local_20[0xf] = local_18->blend_method_;
    local_20[8] = local_18->complete_;
    *(uint8_t **)(local_20 + 10) = puVar1;
    *(size_t *)(local_20 + 0xc) = local_30;
  }
  local_4 = (uint)(puVar1 != (uint8_t *)0x0);
  return local_4;
}

Assistant:

static int SynthesizeFrame(const WebPDemuxer* const dmux,
                           const Frame* const frame,
                           WebPIterator* const iter) {
  const uint8_t* const mem_buf = dmux->mem_.buf_;
  size_t payload_size = 0;
  const uint8_t* const payload = GetFramePayload(mem_buf, frame, &payload_size);
  if (payload == NULL) return 0;
  assert(frame != NULL);

  iter->frame_num      = frame->frame_num_;
  iter->num_frames     = dmux->num_frames_;
  iter->x_offset       = frame->x_offset_;
  iter->y_offset       = frame->y_offset_;
  iter->width          = frame->width_;
  iter->height         = frame->height_;
  iter->has_alpha      = frame->has_alpha_;
  iter->duration       = frame->duration_;
  iter->dispose_method = frame->dispose_method_;
  iter->blend_method   = frame->blend_method_;
  iter->complete       = frame->complete_;
  iter->fragment.bytes = payload;
  iter->fragment.size  = payload_size;
  return 1;
}